

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseMultiChannelEXRHeaderFromMemory(EXRImage *exrImage,uchar *memory,char **err)

{
  pointer *ty;
  bool bVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  byte *pbVar5;
  size_type sVar6;
  uint *puVar7;
  float *pfVar8;
  void *__dest;
  reference __src;
  char **ppcVar9;
  char *pcVar10;
  int *piVar11;
  reference pvVar12;
  int local_15c;
  int i;
  int c_2;
  int c_1;
  int c;
  int dataHeight;
  int dataWidth;
  EXRAttribute attrib;
  char *marker_next;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attrType;
  string attrName;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> customAttribs;
  undefined1 local_98 [4];
  int numCustomAttributes;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  float local_78;
  float fStack_74;
  uchar lineOrder;
  float pixelAspectRatio;
  float screenWindowWidth;
  float screenWindowCenter [2];
  int displayWindow [4];
  int local_50;
  uint local_4c;
  int numChannels;
  int dh;
  int dw;
  int dy;
  int dx;
  char header [4];
  char *marker;
  char *buf;
  char **err_local;
  uchar *memory_local;
  EXRImage *exrImage_local;
  
  if ((exrImage == (EXRImage *)0x0) || (memory == (uchar *)0x0)) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.";
    }
    exrImage_local._4_4_ = -1;
  }
  else {
    dy = 0x1312f76;
    if (*(int *)memory == 0x1312f76) {
      if ((((memory[4] == '\x02') && (memory[5] == '\0')) && (memory[6] == '\0')) &&
         (memory[7] == '\0')) {
        _dx = memory + 8;
        dw = -1;
        dh = -1;
        numChannels = -1;
        local_4c = 0xffffffff;
        local_50 = -1;
        screenWindowCenter[0] = -NAN;
        screenWindowCenter[1] = -NAN;
        displayWindow[0] = -1;
        displayWindow[1] = -1;
        memset(&pixelAspectRatio,0,8);
        fStack_74 = 1.0;
        local_78 = 1.0;
        channels.
        super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        std::
        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ::vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  *)local_98);
        std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::vector
                  ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                   ((long)&attrName.field_2 + 8));
        do {
          std::__cxx11::string::string((string *)(attrType.field_2._M_local_buf + 8));
          ty = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::string((string *)ty);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&marker_next);
          puVar4 = (uchar *)anon_unknown.dwarf_13fc48::ReadAttribute
                                      ((string *)(attrType.field_2._M_local_buf + 8),(string *)ty,
                                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &marker_next,(char *)_dx);
          if (puVar4 == (uchar *)0x0) {
            attrib.value._0_4_ = 2;
            _dx = _dx + 1;
          }
          else {
            iVar2 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
            if (iVar2 == 0) {
              pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &marker_next,0);
              if (4 < *pbVar5) {
                if (err != (char **)0x0) {
                  *err = "Unsupported compression type.";
                }
                exrImage_local._4_4_ = -5;
                attrib.value._0_4_ = 1;
                goto LAB_0026854e;
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
              if (iVar2 == 0) {
                anon_unknown.dwarf_13fc48::ReadChannelInfo
                          ((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                            *)local_98,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&marker_next);
                sVar6 = std::
                        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                        ::size((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                *)local_98);
                local_50 = (int)sVar6;
                if (local_50 < 1) {
                  if (err != (char **)0x0) {
                    *err = "Invalid channels format.";
                  }
                  exrImage_local._4_4_ = -6;
                  attrib.value._0_4_ = 1;
                  goto LAB_0026854e;
                }
              }
              else {
                iVar2 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                if (iVar2 == 0) {
                  piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&marker_next,0);
                  dw = *piVar11;
                  piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&marker_next,4);
                  dh = *piVar11;
                  piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&marker_next,8);
                  numChannels = *piVar11;
                  puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&marker_next,0xc);
                  local_4c = *puVar7;
                  bVar1 = anon_unknown.dwarf_13fc48::IsBigEndian();
                  if (bVar1) {
                    anon_unknown.dwarf_13fc48::swap4((uint *)&dw);
                    anon_unknown.dwarf_13fc48::swap4((uint *)&dh);
                    anon_unknown.dwarf_13fc48::swap4((uint *)&numChannels);
                    anon_unknown.dwarf_13fc48::swap4(&local_4c);
                  }
                }
                else {
                  iVar2 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                  if (iVar2 == 0) {
                    pfVar8 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&marker_next,0);
                    screenWindowCenter[0] = *pfVar8;
                    pfVar8 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&marker_next,4);
                    screenWindowCenter[1] = *pfVar8;
                    piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)&marker_next,8);
                    displayWindow[0] = *piVar11;
                    piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)&marker_next,0xc);
                    displayWindow[1] = *piVar11;
                    bVar1 = anon_unknown.dwarf_13fc48::IsBigEndian();
                    if (bVar1) {
                      anon_unknown.dwarf_13fc48::swap4((uint *)screenWindowCenter);
                      anon_unknown.dwarf_13fc48::swap4((uint *)(screenWindowCenter + 1));
                      anon_unknown.dwarf_13fc48::swap4((uint *)displayWindow);
                      anon_unknown.dwarf_13fc48::swap4((uint *)(displayWindow + 1));
                    }
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                    if (iVar2 == 0) {
                      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &marker_next,0);
                      channels.
                      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = *pbVar5;
                      bVar1 = anon_unknown.dwarf_13fc48::IsBigEndian();
                      if (bVar1) {
                        anon_unknown.dwarf_13fc48::swap4
                                  ((uint *)((long)&channels.
                                                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 7));
                      }
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                      if (iVar2 == 0) {
                        pfVar8 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next,0);
                        local_78 = *pfVar8;
                        bVar1 = anon_unknown.dwarf_13fc48::IsBigEndian();
                        if (bVar1) {
                          anon_unknown.dwarf_13fc48::swap4((uint *)&local_78);
                        }
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                        if (iVar2 == 0) {
                          pfVar8 = (float *)std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next,0);
                          pixelAspectRatio = *pfVar8;
                          pfVar8 = (float *)std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next,4);
                          screenWindowWidth = *pfVar8;
                          bVar1 = anon_unknown.dwarf_13fc48::IsBigEndian();
                          if (bVar1) {
                            anon_unknown.dwarf_13fc48::swap4((uint *)&pixelAspectRatio);
                            anon_unknown.dwarf_13fc48::swap4((uint *)&screenWindowWidth);
                          }
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                          if (iVar2 == 0) {
                            pfVar8 = (float *)std::
                                              vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              ::at((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&marker_next,0);
                            fStack_74 = *pfVar8;
                            bVar1 = anon_unknown.dwarf_13fc48::IsBigEndian();
                            if (bVar1) {
                              anon_unknown.dwarf_13fc48::swap4((uint *)&stack0xffffffffffffff8c);
                            }
                          }
                          else {
                            pcVar10 = (char *)std::__cxx11::string::c_str();
                            _dataHeight = strdup(pcVar10);
                            pcVar10 = (char *)std::__cxx11::string::c_str();
                            attrib.name = strdup(pcVar10);
                            sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next);
                            attrib.type._0_4_ = (undefined4)sVar6;
                            sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next);
                            __dest = malloc(sVar6);
                            attrib._16_8_ = __dest;
                            __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next,0);
                            sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next);
                            memcpy(__dest,__src,sVar6);
                            std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                                      ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                       ((long)&attrName.field_2 + 8),(value_type *)&dataHeight);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            attrib.value._0_4_ = 0;
            _dx = puVar4;
          }
LAB_0026854e:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&marker_next);
          std::__cxx11::string::~string
                    ((string *)
                     &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)(attrType.field_2._M_local_buf + 8));
        } while ((int)attrib.value == 0);
        if ((int)attrib.value == 2) {
          if (dw < 0) {
            __assert_fail("dx >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x2b0c,
                          "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                         );
          }
          if (dh < 0) {
            __assert_fail("dy >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x2b0d,
                          "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                         );
          }
          if (numChannels < 0) {
            __assert_fail("dw >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x2b0e,
                          "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                         );
          }
          if ((int)local_4c < 0) {
            __assert_fail("dh >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x2b0f,
                          "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                         );
          }
          if (local_50 < 1) {
            __assert_fail("numChannels >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x2b10,
                          "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                         );
          }
          iVar2 = numChannels - dw;
          iVar3 = local_4c - dh;
          ppcVar9 = (char **)malloc((long)local_50 << 3);
          exrImage->channel_names = ppcVar9;
          for (c_2 = 0; c_2 < local_50; c_2 = c_2 + 1) {
            std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                          *)local_98,(long)c_2);
            pcVar10 = (char *)std::__cxx11::string::c_str();
            pcVar10 = strdup(pcVar10);
            exrImage->channel_names[c_2] = pcVar10;
          }
          exrImage->num_channels = local_50;
          exrImage->width = iVar2 + 1;
          exrImage->height = iVar3 + 1;
          exrImage->pixel_aspect_ratio = local_78;
          exrImage->screen_window_center[0] = pixelAspectRatio;
          exrImage->screen_window_center[1] = screenWindowWidth;
          exrImage->screen_window_width = fStack_74;
          exrImage->display_window[0] = (int)screenWindowCenter[0];
          exrImage->display_window[1] = (int)screenWindowCenter[1];
          exrImage->display_window[2] = displayWindow[0];
          exrImage->display_window[3] = displayWindow[1];
          exrImage->data_window[0] = dw;
          exrImage->data_window[1] = dh;
          exrImage->data_window[2] = numChannels;
          exrImage->data_window[3] = local_4c;
          exrImage->line_order =
               (uint)channels.
                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
          piVar11 = (int *)malloc((long)local_50 << 2);
          exrImage->pixel_types = piVar11;
          for (i = 0; i < local_50; i = i + 1) {
            pvVar12 = std::
                      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                    *)local_98,(long)i);
            exrImage->pixel_types[i] = pvVar12->pixelType;
          }
          piVar11 = (int *)malloc((long)local_50 << 2);
          exrImage->requested_pixel_types = piVar11;
          for (local_15c = 0; local_15c < local_50; local_15c = local_15c + 1) {
            pvVar12 = std::
                      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                    *)local_98,(long)local_15c);
            exrImage->requested_pixel_types[local_15c] = pvVar12->pixelType;
          }
          exrImage_local._4_4_ = 0;
          attrib.value._0_4_ = 1;
        }
        std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::~vector
                  ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                   ((long)&attrName.field_2 + 8));
        std::
        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ::~vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   *)local_98);
      }
      else {
        if (err != (char **)0x0) {
          *err = "Unsupported version or scanline.";
        }
        exrImage_local._4_4_ = -4;
      }
    }
    else {
      if (err != (char **)0x0) {
        *err = "Header mismatch.";
      }
      exrImage_local._4_4_ = -3;
    }
  }
  return exrImage_local._4_4_;
}

Assistant:

int ParseMultiChannelEXRHeaderFromMemory(EXRImage *exrImage,
                                         const unsigned char *memory,
                                         const char **err) {
  if (exrImage == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 0 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numChannels = -1;
  int displayWindow[4] = {-1, -1, -1, -1}; // @fixme.
  float screenWindowCenter[2] = {0.0f, 0.0f}; // @fixme
  float screenWindowWidth = 1.0f; // @fixme
  float pixelAspectRatio = 1.0f;
  unsigned char lineOrder = 0; // 0 -> increasing y; 1 -> decreasing
  std::vector<ChannelInfo> channels;

  int numCustomAttributes = 0;
  std::vector<EXRAttribute> customAttribs;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs, 3: ZIP or 4: PIZ
      if (data[0] > 4) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }
    } else if (attrName.compare("displayWindow") == 0) {
      memcpy(&displayWindow[0], &data.at(0), sizeof(int));
      memcpy(&displayWindow[1], &data.at(4), sizeof(int));
      memcpy(&displayWindow[2], &data.at(8), sizeof(int));
      memcpy(&displayWindow[3], &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[0]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[1]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[2]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[3]));
      }
    } else if (attrName.compare("lineOrder") == 0) {
      memcpy(&lineOrder, &data.at(0), sizeof(lineOrder));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&lineOrder));
      }
    } else if (attrName.compare("pixelAspectRatio") == 0) {
      memcpy(&pixelAspectRatio, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&pixelAspectRatio));
      }
    } else if (attrName.compare("screenWindowCenter") == 0) {
      memcpy(&screenWindowCenter[0], &data.at(0), sizeof(float));
      memcpy(&screenWindowCenter[1], &data.at(4), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[0]));
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[1]));
      }
    } else if (attrName.compare("screenWindowWidth") == 0) {
      memcpy(&screenWindowWidth, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowWidth));
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (numCustomAttributes < TINYEXR_MAX_ATTRIBUTES) {
        EXRAttribute attrib;
        attrib.name = strdup(attrName.c_str());
        attrib.type = strdup(attrType.c_str());
        attrib.size = data.size();
        attrib.value = (unsigned char*)malloc(data.size());
        memcpy((char*)attrib.value, &data.at(0), data.size());
        customAttribs.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  {
    exrImage->channel_names =
        (const char **)malloc(sizeof(const char *) * numChannels);
    for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
      exrImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
      exrImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
    }
    exrImage->num_channels = numChannels;

    exrImage->width = dataWidth;
    exrImage->height = dataHeight;
    exrImage->pixel_aspect_ratio = pixelAspectRatio;
    exrImage->screen_window_center[0] = screenWindowCenter[0];
    exrImage->screen_window_center[1] = screenWindowCenter[1];
    exrImage->screen_window_width = screenWindowWidth;
    exrImage->display_window[0] = displayWindow[0];
    exrImage->display_window[1] = displayWindow[1];
    exrImage->display_window[2] = displayWindow[2];
    exrImage->display_window[3] = displayWindow[3];
    exrImage->data_window[0] = dx;
    exrImage->data_window[1] = dy;
    exrImage->data_window[2] = dw;
    exrImage->data_window[3] = dh;
    exrImage->line_order = lineOrder;

    exrImage->pixel_types = (int *)malloc(sizeof(int) * numChannels);
    for (int c = 0; c < numChannels; c++) {
      exrImage->pixel_types[c] = channels[c].pixelType;
    }

    // Initially fill with values of `pixel-types`
    exrImage->requested_pixel_types = (int *)malloc(sizeof(int) * numChannels);
    for (int c = 0; c < numChannels; c++) {
      exrImage->requested_pixel_types[c] = channels[c].pixelType;
    }
  }

  if (numCustomAttributes > 0) {
    assert(customAttribs.size() < TINYEXR_MAX_ATTRIBUTES);
    exrImage->num_custom_attributes = numCustomAttributes;

    for (int i = 0; i < (int)customAttribs.size(); i++) {
      exrImage->custom_attributes[i] = customAttribs[i];
    }
  } 

  return 0; // OK
}